

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O3

Abc_Ntk_t *
Abc_NtkMulti(Abc_Ntk_t *pNtk,int nThresh,int nFaninMax,int fCnf,int fMulti,int fSimple,int fFactor)

{
  uint *puVar1;
  long *plVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Ptr_t *pVVar7;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  DdNode *n;
  ProgressBar *p;
  Abc_Ntk_t *pAVar10;
  Vec_Ptr_t *pVVar11;
  uint uVar12;
  long lVar13;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0x44,"Abc_Ntk_t *Abc_NtkMulti(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  if (nThresh < 0) {
    __assert_fail("nThresh >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0x45,"Abc_Ntk_t *Abc_NtkMulti(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  if (nFaninMax < 2) {
    __assert_fail("nFaninMax > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0x46,"Abc_Ntk_t *Abc_NtkMulti(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  iVar4 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar4 != 0) {
    puts("Warning: The choice nodes in the AIG are removed by renoding.");
  }
  if (fCnf == 0) {
    if (fMulti == 0) {
      if (fSimple == 0) {
        if (fFactor == 0) {
          Abc_NtkMultiSetBounds(pNtk,nThresh,nFaninMax);
        }
        else {
          pVVar7 = pNtk->vObjs;
          if (0 < (long)pVVar7->nSize) {
            lVar13 = 0;
            do {
              if ((pVVar7->pArray[lVar13] != (void *)0x0) &&
                 ((*(byte *)((long)pVVar7->pArray[lVar13] + 0x14) & 0x10) != 0)) {
                __assert_fail("pNode->fMarkA == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                              ,0x254,"void Abc_NtkMultiSetBoundsFactor(Abc_Ntk_t *)");
              }
              lVar13 = lVar13 + 1;
            } while (pVVar7->nSize != lVar13);
            lVar13 = 0;
            do {
              pAVar8 = (Abc_Obj_t *)pVVar7->pArray[lVar13];
              if ((pAVar8 != (Abc_Obj_t *)0x0) &&
                 (uVar6 = *(uint *)&pAVar8->field_0x14, (uVar6 & 0xf) == 7)) {
                uVar12 = 0;
                if (1 < (pAVar8->vFanouts).nSize) {
                  iVar4 = Abc_NodeIsMuxControlType(pAVar8);
                  uVar12 = (uint)(iVar4 == 0) << 4;
                  uVar6 = *(uint *)&pAVar8->field_0x14;
                }
                *(uint *)&pAVar8->field_0x14 = uVar6 & 0xffffffef | uVar12;
                pVVar7 = pNtk->vObjs;
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < pVVar7->nSize);
          }
          pVVar7 = pNtk->vCos;
          if (0 < pVVar7->nSize) {
            lVar13 = 0;
            do {
              puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*pVVar7->pArray[lVar13] + 0x20) + 8) +
                                         (long)**(int **)((long)pVVar7->pArray[lVar13] + 0x20) * 8)
                               + 0x14);
              *puVar1 = *puVar1 | 0x10;
              lVar13 = lVar13 + 1;
              pVVar7 = pNtk->vCos;
            } while (lVar13 < pVVar7->nSize);
          }
        }
      }
      else {
        pVVar7 = pNtk->vObjs;
        if (0 < (long)pVVar7->nSize) {
          lVar13 = 0;
          do {
            if ((pVVar7->pArray[lVar13] != (void *)0x0) &&
               ((*(byte *)((long)pVVar7->pArray[lVar13] + 0x14) & 0x10) != 0)) {
              __assert_fail("pNode->fMarkA == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                            ,0x23d,"void Abc_NtkMultiSetBoundsSimple(Abc_Ntk_t *)");
            }
            lVar13 = lVar13 + 1;
          } while (pVVar7->nSize != lVar13);
          lVar13 = 0;
          do {
            pvVar3 = pVVar7->pArray[lVar13];
            if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 7)) {
              *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) | 0x10;
              pVVar7 = pNtk->vObjs;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < pVVar7->nSize);
        }
      }
    }
    else {
      pVVar7 = pNtk->vObjs;
      if (0 < (long)pVVar7->nSize) {
        lVar13 = 0;
        do {
          if ((pVVar7->pArray[lVar13] != (void *)0x0) &&
             ((*(byte *)((long)pVVar7->pArray[lVar13] + 0x14) & 0x10) != 0)) {
            __assert_fail("pNode->fMarkA == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                          ,0x210,"void Abc_NtkMultiSetBoundsMulti(Abc_Ntk_t *, int)");
          }
          lVar13 = lVar13 + 1;
        } while (pVVar7->nSize != lVar13);
        lVar13 = 0;
        do {
          pAVar8 = (Abc_Obj_t *)pVVar7->pArray[lVar13];
          if ((pAVar8 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar8->field_0x14 & 0xf) == 7)) {
            iVar4 = (pAVar8->vFanouts).nSize;
            iVar5 = Abc_NodeMffcSizeStop(pAVar8);
            uVar6 = *(uint *)&pAVar8->field_0x14;
            if (nThresh < (iVar4 + -1) * iVar5) {
              uVar6 = uVar6 | 0x10;
              *(uint *)&pAVar8->field_0x14 = uVar6;
            }
            if ((uVar6 >> 10 & 1) != 0) {
              puVar1 = (uint *)((long)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray] + 0x14)
              ;
              *puVar1 = *puVar1 | 0x10;
              uVar6 = *(uint *)&pAVar8->field_0x14;
            }
            if ((uVar6 >> 0xb & 1) != 0) {
              puVar1 = (uint *)((long)pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[1]] +
                               0x14);
              *puVar1 = *puVar1 | 0x10;
            }
          }
          lVar13 = lVar13 + 1;
          pVVar7 = pNtk->vObjs;
        } while (lVar13 < pVVar7->nSize);
      }
      pVVar7 = pNtk->vCos;
      if (0 < pVVar7->nSize) {
        lVar13 = 0;
        do {
          puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*pVVar7->pArray[lVar13] + 0x20) + 8) +
                                     (long)**(int **)((long)pVVar7->pArray[lVar13] + 0x20) * 8) +
                           0x14);
          *puVar1 = *puVar1 | 0x10;
          lVar13 = lVar13 + 1;
          pVVar7 = pNtk->vCos;
        } while (lVar13 < pVVar7->nSize);
      }
    }
  }
  else {
    pVVar7 = pNtk->vObjs;
    if (0 < (long)pVVar7->nSize) {
      lVar13 = 0;
      do {
        if ((pVVar7->pArray[lVar13] != (void *)0x0) &&
           ((*(byte *)((long)pVVar7->pArray[lVar13] + 0x14) & 0x10) != 0)) {
          __assert_fail("pNode->fMarkA == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                        ,0x1ce,"void Abc_NtkMultiSetBoundsCnf(Abc_Ntk_t *)");
        }
        lVar13 = lVar13 + 1;
      } while (pVVar7->nSize != lVar13);
      lVar13 = 0;
      do {
        pAVar8 = (Abc_Obj_t *)pVVar7->pArray[lVar13];
        if ((pAVar8 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar8->field_0x14 & 0xf) == 7)) {
          if (1 < (pAVar8->vFanouts).nSize) {
            *(uint *)&pAVar8->field_0x14 = *(uint *)&pAVar8->field_0x14 | 0x10;
          }
          iVar4 = Abc_NodeIsMuxType(pAVar8);
          uVar6 = *(uint *)&pAVar8->field_0x14;
          if (iVar4 == 0) {
            if ((uVar6 >> 10 & 1) != 0) {
              puVar1 = (uint *)((long)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray] + 0x14)
              ;
              *puVar1 = *puVar1 | 0x10;
              uVar6 = *(uint *)&pAVar8->field_0x14;
            }
            if ((uVar6 >> 0xb & 1) == 0) goto LAB_002d93a5;
          }
          else {
            *(uint *)&pAVar8->field_0x14 = uVar6 | 0x10;
            plVar2 = (long *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray];
            puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                       (long)*(int *)plVar2[4] * 8) + 0x14);
            *puVar1 = *puVar1 | 0x10;
            plVar2 = (long *)pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[1]];
            puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                       (long)*(int *)plVar2[4] * 8) + 0x14);
            *puVar1 = *puVar1 | 0x10;
            plVar2 = (long *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray];
            puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                       (long)*(int *)(plVar2[4] + 4) * 8) + 0x14);
            *puVar1 = *puVar1 | 0x10;
            pAVar8 = (Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[1]];
          }
          puVar1 = (uint *)((long)pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[1]] + 0x14);
          *puVar1 = *puVar1 | 0x10;
        }
LAB_002d93a5:
        lVar13 = lVar13 + 1;
        pVVar7 = pNtk->vObjs;
      } while (lVar13 < pVVar7->nSize);
    }
    pVVar11 = pNtk->vCos;
    if (0 < pVVar11->nSize) {
      lVar13 = 0;
      do {
        puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*pVVar11->pArray[lVar13] + 0x20) + 8) +
                                   (long)**(int **)((long)pVVar11->pArray[lVar13] + 0x20) * 8) +
                         0x14);
        *puVar1 = *puVar1 | 0x10;
        lVar13 = lVar13 + 1;
        pVVar11 = pNtk->vCos;
      } while (lVar13 < pVVar11->nSize);
      pVVar7 = pNtk->vObjs;
    }
    if (0 < pVVar7->nSize) {
      lVar13 = 0;
      do {
        pAVar8 = (Abc_Obj_t *)pVVar7->pArray[lVar13];
        if ((pAVar8 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar8->field_0x14 & 0xf) == 7)) {
          Abc_NodeIsMuxType(pAVar8);
          pVVar7 = pNtk->vObjs;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < pVVar7->nSize);
    }
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_BDD);
  pAVar8 = Abc_AigConst1(pNtk);
  if (0 < (pAVar8->vFanouts).nSize) {
    pAVar9 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
    n = Cudd_ReadOne((DdManager *)pNtk_00->pManFunc);
    (pAVar9->field_5).pData = n;
    Cudd_Ref(n);
    (pAVar8->field_6).pCopy = pAVar9;
  }
  p = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
  pVVar7 = pNtk->vCos;
  if (0 < pVVar7->nSize) {
    lVar13 = 0;
    do {
      plVar2 = (long *)pVVar7->pArray[lVar13];
      if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar13)) {
        Extra_ProgressBarUpdate_int(p,(int)lVar13,(char *)0x0);
      }
      pAVar8 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      uVar6 = *(uint *)&pAVar8->field_0x14 & 0xf;
      if ((uVar6 != 2) && (uVar6 != 5)) {
        Abc_NtkMulti_rec(pNtk_00,pAVar8);
      }
      lVar13 = lVar13 + 1;
      pVVar7 = pNtk->vCos;
    } while (lVar13 < pVVar7->nSize);
  }
  Extra_ProgressBarStop(p);
  pVVar7 = pNtk->vObjs;
  if (0 < pVVar7->nSize) {
    lVar13 = 0;
    do {
      pvVar3 = pVVar7->pArray[lVar13];
      if (pvVar3 != (void *)0x0) {
        *(byte *)((long)pvVar3 + 0x14) = *(byte *)((long)pvVar3 + 0x14) & 0xef;
        *(undefined8 *)((long)pvVar3 + 0x38) = 0;
        pVVar7 = pNtk->vObjs;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar7->nSize);
  }
  Abc_NtkFinalize(pNtk,pNtk_00);
  Abc_NtkMinimumBase(pNtk_00);
  Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    pAVar10 = Abc_NtkDup(pNtk->pExdc);
    pNtk_00->pExdc = pAVar10;
  }
  iVar4 = Abc_NtkCheck(pNtk_00);
  if (iVar4 == 0) {
    puts("Abc_NtkMulti: The network check has failed.");
    Abc_NtkDelete(pNtk_00);
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkMulti( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax, int fCnf, int fMulti, int fSimple, int fFactor )
{
    Abc_Ntk_t * pNtkNew;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( nThresh >= 0 );
    assert( nFaninMax > 1 );

    // print a warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Warning: The choice nodes in the AIG are removed by renoding.\n" );

    // define the boundary
    if ( fCnf )
        Abc_NtkMultiSetBoundsCnf( pNtk );
    else if ( fMulti )
        Abc_NtkMultiSetBoundsMulti( pNtk, nThresh );
    else if ( fSimple )
        Abc_NtkMultiSetBoundsSimple( pNtk );
    else if ( fFactor )
        Abc_NtkMultiSetBoundsFactor( pNtk );
    else
        Abc_NtkMultiSetBounds( pNtk, nThresh, nFaninMax );

    // perform renoding for this boundary
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_BDD );
    Abc_NtkMultiInt( pNtk, pNtkNew );
    Abc_NtkFinalize( pNtk, pNtkNew );

    // make the network minimum base
    Abc_NtkMinimumBase( pNtkNew );

    // fix the problem with complemented and duplicated CO edges
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );

    // report the number of CNF objects
    if ( fCnf )
    {
//        int nClauses = Abc_NtkGetClauseNum(pNtkNew) + 2*Abc_NtkPoNum(pNtkNew) + 2*Abc_NtkLatchNum(pNtkNew);
//        printf( "CNF variables = %d. CNF clauses = %d.\n",  Abc_NtkNodeNum(pNtkNew), nClauses );
    }
//printf( "Maximum fanin = %d.\n", Abc_NtkGetFaninMax(pNtkNew) );

    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkMulti: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}